

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

void ZSTD_updateTree(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend)

{
  U32 mls;
  BYTE *pBVar1;
  U32 UVar2;
  uint uVar3;
  uint uVar4;
  
  pBVar1 = (ms->window).base;
  uVar3 = (int)ip - (int)pBVar1;
  uVar4 = ms->nextToUpdate;
  if (uVar4 < uVar3) {
    mls = cParams->searchLength;
    do {
      UVar2 = ZSTD_insertBt1(ms,cParams,pBVar1 + uVar4,iend,mls,0);
      uVar4 = uVar4 + UVar2;
    } while (uVar4 < uVar3);
  }
  ms->nextToUpdate = uVar3;
  return;
}

Assistant:

void ZSTD_updateTree(
                ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                const BYTE* ip, const BYTE* iend)
{
    ZSTD_updateTree_internal(ms, cParams, ip, iend, cParams->searchLength, 0 /*extDict*/);
}